

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

Blob<256> * bitreverse<Blob<256>>(Blob<256> *__return_storage_ptr__,Blob<256> *n,size_t b)

{
  uint uVar1;
  Blob<256> t;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  __return_storage_ptr__->bytes[0] = '\0';
  __return_storage_ptr__->bytes[1] = '\0';
  __return_storage_ptr__->bytes[2] = '\0';
  __return_storage_ptr__->bytes[3] = '\0';
  __return_storage_ptr__->bytes[4] = '\0';
  __return_storage_ptr__->bytes[5] = '\0';
  __return_storage_ptr__->bytes[6] = '\0';
  __return_storage_ptr__->bytes[7] = '\0';
  __return_storage_ptr__->bytes[8] = '\0';
  __return_storage_ptr__->bytes[9] = '\0';
  __return_storage_ptr__->bytes[10] = '\0';
  __return_storage_ptr__->bytes[0xb] = '\0';
  __return_storage_ptr__->bytes[0xc] = '\0';
  __return_storage_ptr__->bytes[0xd] = '\0';
  __return_storage_ptr__->bytes[0xe] = '\0';
  __return_storage_ptr__->bytes[0xf] = '\0';
  __return_storage_ptr__->bytes[0x10] = '\0';
  __return_storage_ptr__->bytes[0x11] = '\0';
  __return_storage_ptr__->bytes[0x12] = '\0';
  __return_storage_ptr__->bytes[0x13] = '\0';
  __return_storage_ptr__->bytes[0x14] = '\0';
  __return_storage_ptr__->bytes[0x15] = '\0';
  __return_storage_ptr__->bytes[0x16] = '\0';
  __return_storage_ptr__->bytes[0x17] = '\0';
  __return_storage_ptr__->bytes[0x18] = '\0';
  __return_storage_ptr__->bytes[0x19] = '\0';
  __return_storage_ptr__->bytes[0x1a] = '\0';
  __return_storage_ptr__->bytes[0x1b] = '\0';
  __return_storage_ptr__->bytes[0x1c] = '\0';
  __return_storage_ptr__->bytes[0x1d] = '\0';
  __return_storage_ptr__->bytes[0x1e] = '\0';
  __return_storage_ptr__->bytes[0x1f] = '\0';
  if (b != 0) {
    do {
      local_48 = *(undefined8 *)__return_storage_ptr__->bytes;
      uStack_40 = *(undefined8 *)(__return_storage_ptr__->bytes + 8);
      uStack_38 = *(undefined8 *)(__return_storage_ptr__->bytes + 0x10);
      uStack_30 = *(undefined8 *)(__return_storage_ptr__->bytes + 0x18);
      lshift32(&local_48,0x20,1);
      uVar1 = *(uint *)n->bytes;
      __return_storage_ptr__->bytes[0x10] = '\0';
      __return_storage_ptr__->bytes[0x11] = '\0';
      __return_storage_ptr__->bytes[0x12] = '\0';
      __return_storage_ptr__->bytes[0x13] = '\0';
      __return_storage_ptr__->bytes[0x14] = '\0';
      __return_storage_ptr__->bytes[0x15] = '\0';
      __return_storage_ptr__->bytes[0x16] = '\0';
      __return_storage_ptr__->bytes[0x17] = '\0';
      __return_storage_ptr__->bytes[0x18] = '\0';
      __return_storage_ptr__->bytes[0x19] = '\0';
      __return_storage_ptr__->bytes[0x1a] = '\0';
      __return_storage_ptr__->bytes[0x1b] = '\0';
      __return_storage_ptr__->bytes[0x1c] = '\0';
      __return_storage_ptr__->bytes[0x1d] = '\0';
      __return_storage_ptr__->bytes[0x1e] = '\0';
      __return_storage_ptr__->bytes[0x1f] = '\0';
      __return_storage_ptr__->bytes[4] = '\0';
      __return_storage_ptr__->bytes[5] = '\0';
      __return_storage_ptr__->bytes[6] = '\0';
      __return_storage_ptr__->bytes[7] = '\0';
      __return_storage_ptr__->bytes[8] = '\0';
      __return_storage_ptr__->bytes[9] = '\0';
      __return_storage_ptr__->bytes[10] = '\0';
      __return_storage_ptr__->bytes[0xb] = '\0';
      __return_storage_ptr__->bytes[0xc] = '\0';
      __return_storage_ptr__->bytes[0xd] = '\0';
      __return_storage_ptr__->bytes[0xe] = '\0';
      __return_storage_ptr__->bytes[0xf] = '\0';
      __return_storage_ptr__->bytes[0x10] = '\0';
      __return_storage_ptr__->bytes[0x11] = '\0';
      __return_storage_ptr__->bytes[0x12] = '\0';
      __return_storage_ptr__->bytes[0x13] = '\0';
      *(uint *)__return_storage_ptr__->bytes = uVar1 & 1 | (uint)local_48;
      rshift32(n,0x20,1);
      b = b - 1;
    } while (b != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; ++i, n >>= 1) {
        rv = (rv << 1) | (n & 0x01);
    }
    return rv;
}